

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O0

uint rlLoadTextureCubemap(void *data,int size,int format)

{
  GLint local_58 [2];
  GLint swizzleMask_1 [4];
  GLint swizzleMask [4];
  uint i;
  uint glType;
  uint glFormat;
  uint glInternalFormat;
  uint dataSize;
  uint id;
  int format_local;
  int size_local;
  void *data_local;
  
  glInternalFormat = 0;
  dataSize = format;
  id = size;
  _format_local = data;
  glFormat = rlGetPixelDataSize(size,size,format);
  (*glad_glGenTextures)(1,&glInternalFormat);
  (*glad_glBindTexture)(0x8513,glInternalFormat);
  rlGetGlTextureFormats(dataSize,&glType,&i,(uint *)(swizzleMask + 3));
  if (glType != 0xffffffff) {
    for (swizzleMask[2] = 0; (uint)swizzleMask[2] < 6; swizzleMask[2] = swizzleMask[2] + 1) {
      if (_format_local == (void *)0x0) {
        if ((int)dataSize < 0xb) {
          if (dataSize == 9) {
            if ((RLGL.ExtSupported.texFloat32 & 1U) == 0) {
              TraceLog(4,"TEXTURES: Cubemap requested format not supported");
            }
            else {
              (*glad_glTexImage2D)
                        (swizzleMask[2] + 0x8515,0,0x1907,id,id,0,0x1907,0x1406,(void *)0x0);
            }
          }
          else if ((dataSize == 8) || (dataSize == 10)) {
            TraceLog(4,"TEXTURES: Cubemap requested format not supported");
          }
          else {
            (*glad_glTexImage2D)
                      (swizzleMask[2] + 0x8515,0,glType,id,id,0,i,swizzleMask[3],(void *)0x0);
          }
        }
        else {
          TraceLog(4,"TEXTURES: Empty cubemap creation does not support compressed format");
        }
      }
      else if ((int)dataSize < 0xb) {
        (*glad_glTexImage2D)
                  (swizzleMask[2] + 0x8515,0,glType,id,id,0,i,swizzleMask[3],
                   (void *)((long)_format_local + (ulong)(swizzleMask[2] * glFormat)));
      }
      else {
        (*glad_glCompressedTexImage2D)
                  (swizzleMask[2] + 0x8515,0,glType,id,id,0,glFormat,
                   (void *)((long)_format_local + (ulong)(swizzleMask[2] * glFormat)));
      }
      if (dataSize == 1) {
        swizzleMask_1[2] = 0x1903;
        swizzleMask_1[3] = 0x1903;
        swizzleMask[0] = 0x1903;
        swizzleMask[1] = 1;
        (*glad_glTexParameteriv)(0x8513,0x8e46,swizzleMask_1 + 2);
      }
      else if (dataSize == 2) {
        local_58[0] = 0x1903;
        local_58[1] = 0x1903;
        swizzleMask_1[0] = 0x1903;
        swizzleMask_1[1] = 0x1904;
        (*glad_glTexParameteriv)(0x8513,0x8e46,local_58);
      }
    }
  }
  (*glad_glTexParameteri)(0x8513,0x2801,0x2601);
  (*glad_glTexParameteri)(0x8513,0x2800,0x2601);
  (*glad_glTexParameteri)(0x8513,0x2802,0x812f);
  (*glad_glTexParameteri)(0x8513,0x2803,0x812f);
  (*glad_glTexParameteri)(0x8513,0x8072,0x812f);
  (*glad_glBindTexture)(0x8513,0);
  if (glInternalFormat == 0) {
    TraceLog(4,"TEXTURE: Failed to load cubemap texture");
  }
  else {
    TraceLog(3,"TEXTURE: [ID %i] Cubemap texture loaded successfully (%ix%i)",
             (ulong)glInternalFormat,(ulong)id,(ulong)id);
  }
  return glInternalFormat;
}

Assistant:

unsigned int rlLoadTextureCubemap(void *data, int size, int format)
{
    unsigned int id = 0;

#if defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)
    unsigned int dataSize = rlGetPixelDataSize(size, size, format);

    glGenTextures(1, &id);
    glBindTexture(GL_TEXTURE_CUBE_MAP, id);

    unsigned int glInternalFormat, glFormat, glType;
    rlGetGlTextureFormats(format, &glInternalFormat, &glFormat, &glType);

    if (glInternalFormat != -1)
    {
        // Load cubemap faces
        for (unsigned int i = 0; i < 6; i++)
        {
            if (data == NULL)
            {
                if (format < PIXELFORMAT_COMPRESSED_DXT1_RGB)
                {
                    if (format == PIXELFORMAT_UNCOMPRESSED_R32G32B32)
                    {
                        // Instead of using a sized internal texture format (GL_RGB16F, GL_RGB32F), we let the driver to choose the better format for us (GL_RGB)
                        if (RLGL.ExtSupported.texFloat32) glTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_X + i, 0, GL_RGB, size, size, 0, GL_RGB, GL_FLOAT, NULL);
                        else TRACELOG(LOG_WARNING, "TEXTURES: Cubemap requested format not supported");
                    }
                    else if ((format == PIXELFORMAT_UNCOMPRESSED_R32) || (format == PIXELFORMAT_UNCOMPRESSED_R32G32B32A32)) TRACELOG(LOG_WARNING, "TEXTURES: Cubemap requested format not supported");
                    else glTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_X + i, 0, glInternalFormat, size, size, 0, glFormat, glType, NULL);
                }
                else TRACELOG(LOG_WARNING, "TEXTURES: Empty cubemap creation does not support compressed format");
            }
            else
            {
                if (format < PIXELFORMAT_COMPRESSED_DXT1_RGB) glTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_X + i, 0, glInternalFormat, size, size, 0, glFormat, glType, (unsigned char *)data + i*dataSize);
                else glCompressedTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_X + i, 0, glInternalFormat, size, size, 0, dataSize, (unsigned char *)data + i*dataSize);
            }

#if defined(GRAPHICS_API_OPENGL_33)
            if (format == PIXELFORMAT_UNCOMPRESSED_GRAYSCALE)
            {
                GLint swizzleMask[] = { GL_RED, GL_RED, GL_RED, GL_ONE };
                glTexParameteriv(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_SWIZZLE_RGBA, swizzleMask);
            }
            else if (format == PIXELFORMAT_UNCOMPRESSED_GRAY_ALPHA)
            {
#if defined(GRAPHICS_API_OPENGL_21)
                GLint swizzleMask[] = { GL_RED, GL_RED, GL_RED, GL_ALPHA };
#elif defined(GRAPHICS_API_OPENGL_33)
                GLint swizzleMask[] = { GL_RED, GL_RED, GL_RED, GL_GREEN };
#endif
                glTexParameteriv(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_SWIZZLE_RGBA, swizzleMask);
            }
#endif
        }
    }

    // Set cubemap texture sampling parameters
    glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
    glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
    glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
    glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
#if defined(GRAPHICS_API_OPENGL_33)
    glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_R, GL_CLAMP_TO_EDGE);  // Flag not supported on OpenGL ES 2.0
#endif

    glBindTexture(GL_TEXTURE_CUBE_MAP, 0);
#endif

    if (id > 0) TRACELOG(LOG_INFO, "TEXTURE: [ID %i] Cubemap texture loaded successfully (%ix%i)", id, size, size);
    else TRACELOG(LOG_WARNING, "TEXTURE: Failed to load cubemap texture");

    return id;
}